

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

SpectrumTextureHandle __thiscall
pbrt::TextureParameterDictionary::GetSpectrumTexture
          (TextureParameterDictionary *this,string *name,SpectrumHandle *defaultValue,
          SpectrumType spectrumType,Allocator alloc)

{
  ParameterDictionary *in_RAX;
  uintptr_t iptr;
  ulong *puVar1;
  undefined4 in_register_0000000c;
  long *in_R9;
  SpectrumTextureHandle tex;
  ParameterDictionary *local_28;
  
  local_28 = in_RAX;
  GetSpectrumTextureOrNull
            ((TextureParameterDictionary *)&local_28,name,(SpectrumType)defaultValue,
             (memory_resource *)((ulong)alloc.memoryResource & 0xffffffff));
  if (((ulong)local_28 & 0xffffffffffff) == 0) {
    if ((*(ulong *)CONCAT44(in_register_0000000c,spectrumType) & 0xffffffffffff) == 0) {
      local_28 = (ParameterDictionary *)0x0;
    }
    else {
      puVar1 = (ulong *)(**(code **)(*in_R9 + 0x10))();
      *puVar1 = *(ulong *)CONCAT44(in_register_0000000c,spectrumType);
      local_28 = (ParameterDictionary *)((ulong)puVar1 | 0x7000000000000);
    }
  }
  this->dict = local_28;
  return (SpectrumTextureHandle)
         (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          )this;
}

Assistant:

SpectrumTextureHandle TextureParameterDictionary::GetSpectrumTexture(
    const std::string &name, SpectrumHandle defaultValue, SpectrumType spectrumType,
    Allocator alloc) const {
    SpectrumTextureHandle tex = GetSpectrumTextureOrNull(name, spectrumType, alloc);
    if (tex)
        return tex;
    else if (defaultValue)
        return alloc.new_object<SpectrumConstantTexture>(defaultValue);
    else
        return nullptr;
}